

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O3

void __thiscall Pl_LZWDecoder::addToTable(Pl_LZWDecoder *this,uchar c)

{
  Buffer *this_00;
  uint uVar1;
  pointer pBVar2;
  uchar *__src;
  uchar *__dest;
  __uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> *p_Var3;
  runtime_error *prVar4;
  __uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> _Var5;
  size_t i;
  uchar tmp [1];
  Buffer entry;
  uchar local_91;
  Buffer local_90;
  _Head_base<0UL,_Buffer::Members_*,_false> local_88;
  long local_80;
  _Head_base<0UL,_Buffer::Members_*,_false> _Stack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = this->last_code;
  if (uVar1 < 0x100) {
    __src = &local_91;
    local_91 = (uchar)uVar1;
    i = 1;
  }
  else {
    if (uVar1 < 0x102) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_70,this->last_code);
      std::operator+(&local_50,"Pl_LZWDecoder::addToTable called with invalid code (",&local_70);
      p_Var3 = (__uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> *)
               std::__cxx11::string::append((char *)&local_50);
      local_90.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>.
      _M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
           *(unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> *)&p_Var3->_M_t;
      _Var5._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
           (tuple<Buffer::Members_*,_std::default_delete<Buffer::Members>_>)(p_Var3 + 2);
      if (local_90.m._M_t.
          super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
          super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
          super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl ==
          (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
          _Var5._M_t.
          super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
          super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl) {
        local_80 = *(long *)_Var5._M_t.
                            super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
                            .super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl;
        _Stack_78._M_head_impl = *(Members **)&p_Var3[3]._M_t;
        local_90.m._M_t.
        super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
        super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
        super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
             (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
             (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)&local_80;
      }
      else {
        local_80 = *(long *)_Var5._M_t.
                            super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
                            .super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl;
      }
      local_88._M_head_impl = *(Members **)&p_Var3[1]._M_t;
      p_Var3->_M_t = _Var5._M_t.
                     super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
                     .super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl;
      p_Var3[1]._M_t = (tuple<Buffer::Members_*,_std::default_delete<Buffer::Members>_>)0x0;
      *(undefined1 *)&p_Var3[2]._M_t = 0;
      std::runtime_error::runtime_error(prVar4,(string *)&local_90);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pBVar2 = (this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pBVar2 >> 3) <=
        (ulong)(uVar1 - 0x102)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Pl_LZWDecoder::addToTable: table overflow");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = pBVar2 + (uVar1 - 0x102);
    __src = Buffer::getBuffer(this_00);
    i = Buffer::getSize(this_00);
    if (i >> 0x20 != 0) {
      QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(i);
    }
  }
  Buffer::Buffer(&local_90,(ulong)((int)i + 1));
  __dest = Buffer::getBuffer(&local_90);
  memcpy(__dest,__src,i & 0xffffffff);
  __dest[i & 0xffffffff] = c;
  std::vector<Buffer,_std::allocator<Buffer>_>::emplace_back<Buffer>(&this->table,&local_90);
  Buffer::~Buffer(&local_90);
  return;
}

Assistant:

void
Pl_LZWDecoder::addToTable(unsigned char c)
{
    unsigned int last_size = 0;
    unsigned char const* last_data = nullptr;
    unsigned char tmp[1];

    if (this->last_code < 256) {
        tmp[0] = static_cast<unsigned char>(this->last_code);
        last_data = tmp;
        last_size = 1;
    } else if (this->last_code > 257) {
        unsigned int idx = this->last_code - 258;
        if (idx >= table.size()) {
            throw std::runtime_error("Pl_LZWDecoder::addToTable: table overflow");
        }
        Buffer& b = table.at(idx);
        last_data = b.getBuffer();
        last_size = QIntC::to_uint(b.getSize());
    } else {
        throw std::runtime_error(
            "Pl_LZWDecoder::addToTable called with invalid code (" +
            std::to_string(this->last_code) + ")");
    }

    Buffer entry(1 + last_size);
    unsigned char* new_data = entry.getBuffer();
    memcpy(new_data, last_data, last_size);
    new_data[last_size] = c;
    this->table.push_back(std::move(entry));
}